

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::prepend_copy(xml_node *this,xml_node *proto)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node xVar3;
  xml_node_struct *pxVar4;
  uint uVar5;
  uint uVar6;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  if (proto->_root == (xml_node_struct *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)proto->_root->header & 0xf;
  }
  pxVar4 = this->_root;
  if ((pxVar4 == (xml_node_struct *)0x0) || (uVar6 < 2)) goto LAB_001816e2;
  uVar5 = (uint)pxVar4->header & 0xf;
  if ((uVar5 - 3 < 0xfffffffe) || (0xfffffffd < uVar6 - 9 && uVar5 != 1)) goto LAB_001816e2;
  this_00 = *(xml_allocator **)((long)pxVar4 - (pxVar4->header >> 8));
  uVar1 = this_00->_busy_size + 0x40;
  if (uVar1 < 0x7fd9) {
    pxVar4 = (xml_node_struct *)
             ((long)&((xml_node_struct *)this_00->_root)->prev_sibling_c + this_00->_busy_size);
    this_00->_busy_size = uVar1;
    xVar3._root = (xml_node_struct *)this_00->_root;
LAB_00181685:
    pxVar4->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar4->next_sibling = (xml_node_struct *)0x0;
    pxVar4->parent = (xml_node_struct *)0x0;
    pxVar4->first_child = (xml_node_struct *)0x0;
    pxVar4->name = (char_t *)0x0;
    pxVar4->value = (char_t *)0x0;
    pxVar4->first_attribute = (xml_attribute_struct *)0x0;
    pxVar4->header = (ulong)uVar6 | ((long)pxVar4 - (long)xVar3._root) * 0x100;
  }
  else {
    pxVar4 = (xml_node_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                       (this_00,0x40,(xml_memory_page **)&local_20);
    xVar3._root = local_20._root;
    if (pxVar4 != (xml_node_struct *)0x0) goto LAB_00181685;
    pxVar4 = (xml_node_struct *)0x0;
  }
  xml_node(&local_20,pxVar4);
  if (local_20._root != (xml_node_struct *)0x0) {
    pxVar4 = this->_root;
    (local_20._root)->parent = pxVar4;
    pxVar2 = pxVar4->first_child;
    xVar3._root = local_20._root;
    if (pxVar2 != (xml_node_struct *)0x0) {
      (local_20._root)->prev_sibling_c = pxVar2->prev_sibling_c;
      xVar3._root = pxVar2;
    }
    (xVar3._root)->prev_sibling_c = local_20._root;
    (local_20._root)->next_sibling = pxVar2;
    pxVar4->first_child = local_20._root;
    impl::anon_unknown_0::node_copy_tree(local_20._root,proto->_root);
    return (xml_node)local_20._root;
  }
LAB_001816e2:
  xml_node(&local_28);
  return (xml_node)local_28._root;
}

Assistant:

PUGI__FN xml_node xml_node::prepend_copy(const xml_node& proto)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::prepend_node(n._root, _root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}